

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool util::compareString(string *str1,char *str2)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  int local_24;
  int i;
  char *str2_local;
  string *str1_local;
  
  sVar3 = std::__cxx11::string::size();
  sVar4 = strlen(str2);
  if (sVar3 == sVar4) {
    for (local_24 = 0; uVar5 = std::__cxx11::string::size(), (ulong)(long)local_24 < uVar5;
        local_24 = local_24 + 1) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)str1);
      iVar1 = tolower((int)*pcVar6);
      iVar2 = tolower((int)str2[local_24]);
      if (iVar1 != iVar2) {
        return false;
      }
    }
    str1_local._7_1_ = true;
  }
  else {
    str1_local._7_1_ = false;
  }
  return str1_local._7_1_;
}

Assistant:

bool util::compareString(const string &str1, const char* str2){
    if(str1.size() != strlen(str2))
        return false;
    for(int i = 0; i < str1.size(); i++)
        if(tolower(str1[i]) != tolower(str2[i]))
            return false;
    return true;
}